

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

string * __thiscall
cfd::core::ScriptOperator::ToCodeString_abi_cxx11_
          (string *__return_storage_ptr__,ScriptOperator *this)

{
  bool bVar1;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *__return_storage_ptr___00;
  char *in_stack_ffffffffffffff78;
  allocator *paVar2;
  string local_58;
  int local_34;
  allocator local_2e;
  allocator local_2d;
  int num;
  allocator local_19;
  ScriptOperator *local_18;
  ScriptOperator *this_local;
  
  local_18 = this;
  this_local = (ScriptOperator *)__return_storage_ptr__;
  bVar1 = ::std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"OP_0",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    bVar1 = ::std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"OP_1NEGATE",&local_2d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    }
    else {
      bVar1 = ::std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar1) {
        paVar2 = &local_2e;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"OP_1",paVar2);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      }
      else if (((int)this->data_type_ < 0x52) || (0x60 < (int)this->data_type_)) {
        ToString_abi_cxx11_(__return_storage_ptr__,this);
      }
      else {
        local_34 = this->data_type_ - kOpReserved;
        __return_storage_ptr___00 = &local_58;
        ::std::__cxx11::to_string(__return_storage_ptr___00,local_34);
        ::std::operator+(in_stack_ffffffffffffff78,__return_storage_ptr___00);
        ::std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToCodeString() const {
  if (text_data_ == "0") {
    return "OP_0";
  } else if (text_data_ == "-1") {
    return "OP_1NEGATE";
  } else if (text_data_ == "1") {
    return "OP_1";
  } else if (
      (data_type_ >= ScriptType::kOp_2) &&
      (data_type_ <= ScriptType::kOp_16)) {
    int num = static_cast<int>(data_type_);
    num -= static_cast<int>(ScriptType::kOp_1);
    num += 1;
    return "OP_" + std::to_string(num);
  }
  return ToString();
}